

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2ec4d::TestOutOfCoreCHECKMacrosCanFailTests::RunImpl
          (TestOutOfCoreCHECKMacrosCanFailTests *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  ScopedCurrentTest scopedResult;
  TestResults results;
  int local_54;
  ScopedCurrentTest local_50;
  TestDetails local_40;
  TestResults local_20;
  
  UnitTest::TestResults::TestResults(&local_20,(TestReporter *)0x0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  local_50.m_oldTestResults = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  local_50.m_oldTestDetails = *ppTVar3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  *ppTVar2 = &local_20;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x73);
  UnitTest::TestResults::OnTestFailure(pTVar1,&local_40,"false");
  ScopedCurrentTest::~ScopedCurrentTest(&local_50);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_50.m_oldTestResults = (TestResults *)CONCAT44(local_50.m_oldTestResults._4_4_,1);
  local_54 = UnitTest::TestResults::GetFailureCount(&local_20);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x7e);
  UnitTest::CheckEqual<int,int>(pTVar1,(int *)&local_50,&local_54,&local_40);
  return;
}

Assistant:

TEST(OutOfCoreCHECKMacrosCanFailTests)
{
	TestResults results;
	{
		ScopedCurrentTest scopedResult(results);
		Fail();
	}

	CHECK_EQUAL(1, results.GetFailureCount());
}